

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O0

void __thiscall Component_contains_Test::TestBody(Component_contains_Test *this)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  char *pcVar4;
  AssertionResult local_1b0 [2];
  AssertHelper local_190 [8];
  Message local_188 [15];
  bool local_179;
  undefined1 local_178 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_148 [8];
  Message local_140 [15];
  bool local_131;
  undefined1 local_130 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_100 [8];
  Message local_f8 [15];
  allocator<char> local_e9;
  string local_e8 [39];
  bool local_c1;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_;
  string local_a8 [55];
  allocator<char> local_71;
  string local_70 [32];
  undefined1 local_50 [8];
  ComponentPtr c21;
  ComponentPtr c2;
  ComponentPtr c1;
  ComponentPtr c;
  Component_contains_Test *this_local;
  
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::Component::create();
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_70,"child1",&local_71);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c21.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a8,"child2",(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c21.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e8,"child1",&local_e9);
  bVar1 = libcellml::ComponentEntity::containsComponent((string *)peVar3,SUB81(local_e8,0));
  local_c1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c0,&local_c1,(type *)0x0)
  ;
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar2) {
    testing::Message::Message(local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__1.message_,local_c0,"c->containsComponent(\"child1\")",
               "true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/component.cpp"
               ,0x94,pcVar4);
    testing::internal::AssertHelper::operator=(local_100,local_f8);
    testing::internal::AssertHelper::~AssertHelper(local_100);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  bVar1 = libcellml::ComponentEntity::containsComponent
                    ((shared_ptr *)peVar3,(bool)((char)&c21 + '\b'));
  local_131 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_130,&local_131,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar2) {
    testing::Message::Message(local_140);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__2.message_,local_130,"c->containsComponent(c2)","false"
              );
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/component.cpp"
               ,0x98,pcVar4);
    testing::internal::AssertHelper::operator=(local_148,local_140);
    testing::internal::AssertHelper::~AssertHelper(local_148);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  bVar1 = libcellml::ComponentEntity::containsComponent((shared_ptr *)peVar3,SUB81(local_50,0));
  local_179 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_178,&local_179,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar2) {
    testing::Message::Message(local_188);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_1b0,local_178,"c->containsComponent(c21)","false");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/component/component.cpp"
               ,0x99,pcVar4);
    testing::internal::AssertHelper::operator=(local_190,local_188);
    testing::internal::AssertHelper::~AssertHelper(local_190);
    std::__cxx11::string::~string((string *)local_1b0);
    testing::Message::~Message(local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_50);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &c21.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &c2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &c1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Component, contains)
{
    libcellml::ComponentPtr c = libcellml::Component::create();
    libcellml::ComponentPtr c1 = libcellml::Component::create();
    libcellml::ComponentPtr c2 = libcellml::Component::create();
    libcellml::ComponentPtr c21 = libcellml::Component::create();
    c1->setName("child1");
    c2->setName("child2");
    c2->addComponent(c21);

    EXPECT_FALSE(c->containsComponent("child1"));

    c->addComponent(c1);
    c->addComponent(c2);
    EXPECT_TRUE(c->containsComponent(c2));
    EXPECT_TRUE(c->containsComponent(c21));
}